

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictPoolPropagation::conflictAdded(ConflictPoolPropagation *this,HighsInt conflict)

{
  long lVar1;
  HighsBoundType HVar2;
  bool bVar3;
  int iVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar11;
  byte *pbVar12;
  reference pvVar13;
  int in_ESI;
  long in_RDI;
  HighsInt watchPos_2;
  HighsInt pos_1;
  HighsInt i_3;
  HighsInt latestPos;
  HighsInt latestActive_1;
  HighsInt watchPos_1;
  HighsInt i_2;
  HighsInt pos;
  HighsInt i_1;
  HighsInt numActive;
  array<std::pair<int,_int>,_2UL> latestActive;
  HighsInt watchPos;
  HighsInt i;
  HighsInt numWatched;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *conflictEntries;
  HighsInt end;
  HighsInt start;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  HighsInt HVar14;
  ConflictPoolPropagation *in_stack_ffffffffffffff00;
  array<std::pair<int,_int>,_2UL> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  value_type vVar15;
  HighsDomain *in_stack_ffffffffffffff20;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *this_01;
  undefined8 in_stack_ffffffffffffff28;
  ConflictPoolPropagation *in_stack_ffffffffffffff30;
  int local_a0;
  int local_74;
  int local_70;
  int local_6c;
  int local_64;
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  pair<int,_int> local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_2c;
  int local_28;
  int local_24;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  pvVar5 = HighsConflictPool::getConflictRanges(*(HighsConflictPool **)(in_RDI + 0x10));
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (pvVar5,(long)local_c);
  local_10 = pvVar6->first;
  pvVar5 = HighsConflictPool::getConflictRanges(*(HighsConflictPool **)(in_RDI + 0x10));
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (pvVar5,(long)local_c);
  local_14 = pvVar6->second;
  local_20 = HighsConflictPool::getConflictEntryVector(*(HighsConflictPool **)(in_RDI + 0x10));
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48));
  if ((int)sVar7 <= local_c) {
    std::
    vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
    ::resize((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
              *)in_stack_ffffffffffffff20,
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&in_stack_ffffffffffffff20->changedcolsflags_,
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  local_24 = 0;
  for (local_28 = local_10; local_28 != local_14; local_28 = local_28 + 1) {
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              (local_20,(long)local_28);
    bVar3 = isActive(in_stack_ffffffffffffff20,
                     (HighsDomainChange *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (!bVar3) {
      local_2c = local_c * 2 + local_24;
      pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_20,(long)local_28);
      pvVar9 = std::
               vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                             *)(in_RDI + 0x78),(long)local_2c);
      (pvVar9->domchg).boundval = pvVar8->boundval;
      HVar2 = pvVar8->boundtype;
      (pvVar9->domchg).column = pvVar8->column;
      (pvVar9->domchg).boundtype = HVar2;
      linkWatchedLiteral(in_stack_ffffffffffffff30,
                         (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      local_24 = local_24 + 1;
      if (local_24 == 2) break;
    }
  }
  if (local_24 == 0) {
    std::array<std::pair<int,_int>,_2UL>::array(in_stack_ffffffffffffff10);
    local_40 = 0;
    for (local_44 = local_10; local_44 != local_14; local_44 = local_44 + 1) {
      pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_20,(long)local_44);
      if (pvVar8->boundtype == kLower) {
        lVar1 = *(long *)(in_RDI + 8);
        pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_20,(long)local_44);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x290),
                             (long)pvVar8->column);
        local_a0 = *pvVar11;
      }
      else {
        lVar1 = *(long *)(in_RDI + 8);
        pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_20,(long)local_44);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x2a8),
                             (long)pvVar8->column);
        local_a0 = *pvVar11;
      }
      local_48 = local_a0;
      if (local_40 == 0) {
        local_50 = std::make_pair<int&,int&>
                             ((int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              (int *)0x5bba5d);
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        std::pair<int,_int>::operator=(pvVar10,&local_50);
        local_40 = 1;
      }
      else if (local_40 == 1) {
        local_58 = std::make_pair<int&,int&>
                             ((int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              (int *)0x5bbaab);
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        std::pair<int,_int>::operator=(pvVar10,&local_58);
        local_40 = 2;
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        iVar4 = pvVar10->first;
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        if (iVar4 < pvVar10->first) {
          std::array<std::pair<int,_int>,_2UL>::operator[]
                    ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          std::array<std::pair<int,_int>,_2UL>::operator[]
                    ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          std::swap<int,int>((pair<int,_int> *)in_stack_ffffffffffffff00,
                             (pair<int,_int> *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        }
      }
      else if ((local_40 == 2) &&
              (pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                                   ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
              pvVar10->first < local_a0)) {
        local_60 = std::make_pair<int&,int&>
                             ((int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              (int *)0x5bbb8f);
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        std::pair<int,_int>::operator=(pvVar10,&local_60);
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        iVar4 = pvVar10->first;
        pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                            ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        if (iVar4 < pvVar10->first) {
          in_stack_ffffffffffffff30 =
               (ConflictPoolPropagation *)
               std::array<std::pair<int,_int>,_2UL>::operator[]
                         ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          std::array<std::pair<int,_int>,_2UL>::operator[]
                    ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                     CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          std::swap<int,int>((pair<int,_int> *)in_stack_ffffffffffffff00,
                             (pair<int,_int> *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        }
      }
    }
    for (local_64 = 0; local_64 < local_40; local_64 = local_64 + 1) {
      iVar4 = local_c * 2;
      this_01 = local_20;
      pvVar10 = std::array<std::pair<int,_int>,_2UL>::operator[]
                          ((array<std::pair<int,_int>,_2UL> *)in_stack_ffffffffffffff00,
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (this_01,(long)pvVar10->second);
      pvVar9 = std::
               vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                             *)(in_RDI + 0x78),(long)(iVar4 + local_64));
      (pvVar9->domchg).boundval = pvVar8->boundval;
      HVar2 = pvVar8->boundtype;
      (pvVar9->domchg).column = pvVar8->column;
      (pvVar9->domchg).boundtype = HVar2;
      linkWatchedLiteral(in_stack_ffffffffffffff30,(HighsInt)((ulong)pvVar8 >> 0x20));
    }
  }
  else if (local_24 == 1) {
    local_6c = -1;
    local_70 = -1;
    for (local_74 = local_10; HVar14 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),
        local_74 != local_14; local_74 = local_74 + 1) {
      pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_20,(long)local_74);
      if (pvVar8->boundtype == kLower) {
        this_00 = (vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 8) + 0x290);
        pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_20,(long)local_74);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)pvVar8->column);
        vVar15 = *pvVar11;
      }
      else {
        lVar1 = *(long *)(in_RDI + 8);
        pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_20,(long)local_74);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x2a8),
                             (long)pvVar8->column);
        vVar15 = *pvVar11;
      }
      if (local_70 < vVar15) {
        local_6c = local_74;
        local_70 = vVar15;
      }
    }
    if (local_6c != -1) {
      iVar4 = local_c * 2;
      in_stack_ffffffffffffff00 =
           (ConflictPoolPropagation *)
           std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                     (local_20,(long)local_6c);
      pvVar9 = std::
               vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                             *)(in_RDI + 0x78),(long)(iVar4 + 1));
      (pvVar9->domchg).boundval = *(double *)in_stack_ffffffffffffff00;
      *(HighsDomain **)&(pvVar9->domchg).column = in_stack_ffffffffffffff00->domain;
      linkWatchedLiteral(in_stack_ffffffffffffff30,HVar14);
    }
  }
  iVar4 = local_24;
  pbVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48),
                       (long)local_c);
  HVar14 = CONCAT13((byte)iVar4 | *pbVar12 & 4,(int3)in_stack_fffffffffffffefc);
  pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48),
                       (long)local_c);
  *pvVar13 = (value_type)((uint)HVar14 >> 0x18);
  markPropagateConflict(in_stack_ffffffffffffff00,HVar14);
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::conflictAdded(HighsInt conflict) {
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;
  const std::vector<HighsDomainChange>& conflictEntries =
      conflictpool_->getConflictEntryVector();

  if (HighsInt(conflictFlag_.size()) <= conflict) {
    watchedLiterals_.resize(2 * conflict + 2);
    conflictFlag_.resize(conflict + 1);
  }

  HighsInt numWatched = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(conflictEntries[i])) continue;
    HighsInt watchPos = 2 * conflict + numWatched;
    watchedLiterals_[watchPos].domchg = conflictEntries[i];
    linkWatchedLiteral(watchPos);
    if (++numWatched == 2) break;
  }
  switch (numWatched) {
    case 0: {
      std::array<std::pair<HighsInt, HighsInt>, 2> latestActive;
      HighsInt numActive = 0;
      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        switch (numActive) {
          case 0:
            latestActive[0] = std::make_pair(pos, i);
            numActive = 1;
            break;
          case 1:
            latestActive[1] = std::make_pair(pos, i);
            numActive = 2;
            if (latestActive[0].first < latestActive[1].first)
              std::swap(latestActive[0], latestActive[1]);
            break;
          case 2:
            if (pos > latestActive[1].first) {
              latestActive[1] = std::make_pair(pos, i);
              if (latestActive[0].first < latestActive[1].first)
                std::swap(latestActive[0], latestActive[1]);
            }
        }
      }
      for (HighsInt i = 0; i < numActive; ++i) {
        HighsInt watchPos = 2 * conflict + i;
        watchedLiterals_[watchPos].domchg =
            conflictEntries[latestActive[i].second];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 1: {
      HighsInt latestActive = -1;
      HighsInt latestPos = -1;

      for (HighsInt i = start; i != end; ++i) {
        HighsInt pos = conflictEntries[i].boundtype == HighsBoundType::kLower
                           ? domain->colLowerPos_[conflictEntries[i].column]
                           : domain->colUpperPos_[conflictEntries[i].column];
        if (pos > latestPos) {
          latestActive = i;
          latestPos = pos;
        }
      }
      if (latestActive != -1) {
        HighsInt watchPos = 2 * conflict + 1;
        watchedLiterals_[watchPos].domchg = conflictEntries[latestActive];
        linkWatchedLiteral(watchPos);
      }
      break;
    }
    case 2:
      break;
  }

  conflictFlag_[conflict] = numWatched | (conflictFlag_[conflict] & 4);
  markPropagateConflict(conflict);
}